

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O0

int round_floor(int ref_pos,int bsize_pix)

{
  int round;
  int bsize_pix_local;
  int ref_pos_local;
  
  if (ref_pos < 0) {
    round = -((-1 - ref_pos) / bsize_pix + 1);
  }
  else {
    round = ref_pos / bsize_pix;
  }
  return round;
}

Assistant:

static int round_floor(int ref_pos, int bsize_pix) {
  int round;
  if (ref_pos < 0)
    round = -(1 + (-ref_pos - 1) / bsize_pix);
  else
    round = ref_pos / bsize_pix;

  return round;
}